

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O1

void DelocateQueques(void)

{
  void *__ptr;
  long lVar1;
  
  lVar1 = 0x18;
  do {
    if (*(void **)((long)&s_DiffVarValueP_new + lVar1) != (void *)0x0) {
      free(*(void **)((long)&s_DiffVarValueP_new + lVar1));
      *(undefined8 *)((long)&s_DiffVarValueP_new + lVar1) = 0;
    }
    if (*(void **)((long)&s_pCubeLast + lVar1) != (void *)0x0) {
      free(*(void **)((long)&s_pCubeLast + lVar1));
      *(undefined8 *)((long)&s_pCubeLast + lVar1) = 0;
    }
    if (*(void **)((long)&s_nPosAlloc + lVar1) != (void *)0x0) {
      free(*(void **)((long)&s_nPosAlloc + lVar1));
      *(undefined8 *)((long)&s_nPosAlloc + lVar1) = 0;
    }
    __ptr = *(void **)((long)&s_Que[0].pC1 + lVar1);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      *(undefined8 *)((long)&s_Que[0].pC1 + lVar1) = 0;
    }
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0xc0);
  return;
}

Assistant:

void DelocateQueques()
{
    int i;
    for ( i = 0; i < 3; i++ )
    {
        ABC_FREE( s_Que[i].pC1 );
        ABC_FREE( s_Que[i].pC2 );
        ABC_FREE( s_Que[i].ID1 );
        ABC_FREE( s_Que[i].ID2 );
    }
}